

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O1

bool __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
::insert(FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
         *this,shared_ptr<PartialJPDPValuePair> *a,shared_ptr<PartialJPDPValuePair> *overflown_T)

{
  _List_node_base **pp_Var1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  sp_counted_base *psVar6;
  element_type *peVar7;
  bool bVar8;
  _Self __tmp;
  const_iterator __position;
  double dVar9;
  double dVar10;
  shared_count sStack_70;
  long *local_68;
  shared_count sStack_60;
  element_type *local_58;
  shared_count sStack_50;
  _List_node_base *local_48;
  shared_count asStack_40 [2];
  
  sVar3 = (this->_m_l).
          super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
          ._M_impl._M_node._M_size;
  sVar4 = this->_m_capacity;
  if (sVar3 == sVar4) {
    p_Var5 = (this->_m_l).
             super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_48 = p_Var5[1]._M_next;
    asStack_40[0].pi_ = (sp_counted_base *)p_Var5[1]._M_prev;
    if (p_Var5[1]._M_prev != (_List_node_base *)0x0) {
      LOCK();
      pp_Var1 = &(p_Var5[1]._M_prev)->_M_prev;
      *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
      UNLOCK();
    }
    psVar6 = (a->pn).pi_;
    local_58 = a->px;
    sStack_50.pi_ = (a->pn).pi_;
    if (psVar6 != (sp_counted_base *)0x0) {
      LOCK();
      piVar2 = &psVar6->use_count_;
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    dVar9 = (double)(*(code *)local_48->_M_next[1]._M_prev)();
    dVar10 = dVar9;
    (*(local_58->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[3])();
    boost::detail::shared_count::~shared_count(&sStack_50);
    boost::detail::shared_count::~shared_count(asStack_40);
    if (dVar10 <= dVar9) {
      boost::shared_ptr<PartialJPDPValuePair>::operator=(overflown_T,a);
      goto LAB_00386655;
    }
    boost::shared_ptr<PartialJPDPValuePair>::operator=
              (overflown_T,(shared_ptr<PartialJPDPValuePair> *)(p_Var5 + 1));
    std::__cxx11::
    list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::_M_erase(&this->_m_l,
               (this->_m_l).
               super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev);
  }
  __position._M_node =
       (this->_m_l).
       super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if ((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
       *)__position._M_node != this) {
    bVar8 = true;
    do {
      local_68 = (long *)(((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                            *)__position._M_node)->_m_l).
                         super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                         ._M_impl._M_node._M_size;
      sStack_60.pi_ =
           (sp_counted_base *)
           ((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
             *)__position._M_node)->_m_capacity;
      if (((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)__position._M_node)->_m_capacity != 0) {
        LOCK();
        piVar2 = (int *)(((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                           *)__position._M_node)->_m_capacity + 8);
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      psVar6 = (a->pn).pi_;
      peVar7 = a->px;
      sStack_70.pi_ = (a->pn).pi_;
      if (psVar6 != (sp_counted_base *)0x0) {
        LOCK();
        piVar2 = &psVar6->use_count_;
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      dVar9 = (double)(**(code **)(*local_68 + 0x18))();
      dVar10 = dVar9;
      (*(peVar7->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
        _vptr_PartialPolicyPoolItemInterface[3])();
      boost::detail::shared_count::~shared_count(&sStack_70);
      boost::detail::shared_count::~shared_count(&sStack_60);
      if (dVar10 <= dVar9) {
        __position._M_node =
             (((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)__position._M_node)->_m_l).
             super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
      }
      else {
        bVar8 = false;
      }
    } while (((FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
               *)__position._M_node != this) && (bVar8));
  }
  std::__cxx11::
  list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::insert(&this->_m_l,__position,a);
LAB_00386655:
  return sVar3 == sVar4;
}

Assistant:

bool FixedCapacityPriorityQueue<T,_Compare>::insert( T& a, T& overflown_T )
{
    bool overflow = ( _m_l.size() == _m_capacity);
    bool skip_insert = false;

    if(overflow) //check if we need to make space at the end
    {
        // overflown_Tp is the T* to which overflown_Tpp points
        // we set the former to point to the overflown element.
        //T* & overflown_Tp = *overflown_Tpp;

        T& last_in_queue = _m_l.back();
        //std::less< T > theLessOp;
        _Compare theLessOp;
        if( theLessOp( last_in_queue,  a) )
        //if( last_in_queue <  a ) //doesn't work automatically...
        {
            //This does not work with (or need) pointers, 
            //this simply points to last position in queue !!!
            //overflown_Tp = &last_in_queue;             
            
            //rather copy the value of the stuff we will throw out!
            overflown_T = last_in_queue; 
            _m_l.pop_back();
        }
        else
        {
            overflown_T = a;
            skip_insert = true;
        }
    }

    if(!skip_insert)
    {
        //insert a at the appropriate place
        typename std::list<T>::iterator it = _m_l.begin();
        typename std::list<T>::iterator last = _m_l.end();
        bool not_positioned = true; //so long as it does not point to the correct pos.
        //std::less< T > theLessOp;
        _Compare theLessOp;
        while(it != last && not_positioned)
        {
            if( theLessOp( *it, a ) )
                not_positioned = false;
            else
                it++;
        }
        _m_l.insert( it, a);
    }
#if 0 && DEBUG_FCPQ
    std::cout << "----AFTER POP AND INSERT\nthe overflown_Tp=" <<overflown_Tp << ", which means it points to..." <<std::endl ;
    if(overflown_Tp != NULL)
    {
        T& the_overflown_T = (*overflown_Tp);
        std::string typestr = " JPPVValPair* ";
        std::cout << "the_overflown_T [T="<< typestr <<
            "]=" << the_overflown_T << ", which points to..."<<std::endl;

        if(the_overflown_T != NULL)
            std::cout<< (*the_overflown_T).SoftPrintBrief() << std::endl;
        else
            std::cout << "nothing" <<std::endl;
    }
    else
        std::cout << " nothing." << std::endl;
    
    std::cout << "----" <<std::endl ;
#endif
    
    return(overflow);
}